

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void print_tests(FILE *stream)

{
  int iVar1;
  int local_202c;
  int local_2028;
  int i;
  int n_tasks;
  int n_helpers;
  task_entry_t *task;
  task_entry_t *helpers [1024];
  FILE *stream_local;
  
  local_2028 = 0;
  for (_n_tasks = TASKS; _n_tasks->main != (_func_int *)0x0; _n_tasks = _n_tasks + 1) {
    local_2028 = local_2028 + 1;
  }
  qsort(TASKS,(long)local_2028,0x28,compare_task);
  for (_n_tasks = TASKS; _n_tasks->main != (_func_int *)0x0; _n_tasks = _n_tasks + 1) {
    if (_n_tasks->is_helper == 0) {
      iVar1 = find_helpers(_n_tasks,&task);
      if (iVar1 == 0) {
        printf("%s\n",_n_tasks->task_name);
      }
      else {
        printf("%-25s (helpers:",_n_tasks->task_name);
        for (local_202c = 0; local_202c < iVar1; local_202c = local_202c + 1) {
          printf(" %s",helpers[(long)local_202c + -1]->process_name);
        }
        printf(")\n");
      }
    }
  }
  return;
}

Assistant:

void print_tests(FILE* stream) {
  const task_entry_t* helpers[1024];
  const task_entry_t* task;
  int n_helpers;
  int n_tasks;
  int i;

  for (n_tasks = 0, task = TASKS; task->main; n_tasks++, task++);
  qsort(TASKS, n_tasks, sizeof(TASKS[0]), compare_task);

  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    n_helpers = find_helpers(task, helpers);
    if (n_helpers) {
      printf("%-25s (helpers:", task->task_name);
      for (i = 0; i < n_helpers; i++) {
        printf(" %s", helpers[i]->process_name);
      }
      printf(")\n");
    } else {
      printf("%s\n", task->task_name);
    }
  }
}